

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lha_read_file_extended_header
                  (archive_read *a,lha *lha,uint16_t *crc,wchar_t sizefield_length,size_t limitsize,
                  size_t *total_size)

{
  uint16_t uVar1;
  wchar_t wVar2;
  uint32_t uVar3;
  void *pvVar4;
  ulong uVar5;
  void *pp;
  time_t tVar6;
  uint64_t uVar7;
  archive_string_conv *paVar8;
  int in_ECX;
  uint16_t *in_RDX;
  long in_RSI;
  archive *in_RDI;
  ulong in_R8;
  long *in_R9;
  char *charset;
  archive_string cp;
  uchar extdtype;
  uint i;
  size_t datasize;
  size_t extdsize;
  uchar *extdheader;
  void *h;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  archive_read *in_stack_ffffffffffffff80;
  archive_read *charset_00;
  archive_conflict *in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  ulong local_50;
  
  *in_R9 = (long)in_ECX;
  while( true ) {
    pvVar4 = __archive_read_ahead
                       (in_stack_ffffffffffffff80,
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (ssize_t *)0x151dd4);
    if (pvVar4 == (void *)0x0) {
      wVar2 = truncated_error((archive_read *)0x151de9);
      return wVar2;
    }
    if (in_ECX == 2) {
      uVar1 = archive_le16dec(pvVar4);
      local_50 = (ulong)uVar1;
    }
    else {
      uVar3 = archive_le32dec(pvVar4);
      local_50 = (ulong)uVar3;
    }
    if (local_50 == 0) {
      if (in_RDX != (uint16_t *)0x0) {
        uVar1 = lha_crc16(*in_RDX,pvVar4,(long)in_ECX);
        *in_RDX = uVar1;
      }
      __archive_read_consume
                (in_stack_ffffffffffffff80,
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      return L'\0';
    }
    if ((in_R8 < *in_R9 + local_50) || (local_50 <= (ulong)(long)in_ECX)) break;
    pvVar4 = __archive_read_ahead
                       (in_stack_ffffffffffffff80,
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (ssize_t *)0x151eb4);
    if (pvVar4 == (void *)0x0) {
      wVar2 = truncated_error((archive_read *)0x151ec9);
      return wVar2;
    }
    *in_R9 = local_50 + *in_R9;
    in_stack_ffffffffffffffa0 =
         CONCAT13(*(char *)((long)pvVar4 + (long)in_ECX),(int3)in_stack_ffffffffffffffa0);
    uVar5 = local_50 - (long)(in_ECX + 1);
    pp = (void *)((long)pvVar4 + (long)(in_ECX + 1));
    if ((in_RDX != (uint16_t *)0x0) && (*(char *)((long)pvVar4 + (long)in_ECX) != '\0')) {
      uVar1 = lha_crc16(*in_RDX,pvVar4,local_50);
      *in_RDX = uVar1;
    }
    in_stack_ffffffffffffff7c = in_stack_ffffffffffffffa0 >> 0x18;
    if (in_stack_ffffffffffffff7c == 0) {
      if (1 < uVar5) {
        uVar1 = archive_le16dec(pp);
        *(uint16_t *)(in_RSI + 0xc0) = uVar1;
        if (in_RDX != (uint16_t *)0x0) {
          uVar1 = lha_crc16(*in_RDX,pvVar4,local_50 - uVar5);
          *in_RDX = uVar1;
          uVar1 = lha_crc16(*in_RDX,"",2);
          *in_RDX = uVar1;
          uVar1 = lha_crc16(*in_RDX,(void *)((long)pp + 2),uVar5 - 2);
          *in_RDX = uVar1;
        }
      }
    }
    else if (in_stack_ffffffffffffff7c == 1) {
      if (uVar5 == 0) {
        *(undefined8 *)(in_RSI + 0xf8) = 0;
      }
      else {
        *(undefined8 *)(in_RSI + 0xf8) = 0;
        archive_strncat((archive_string *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
      }
    }
    else if (in_stack_ffffffffffffff7c == 2) {
      if (uVar5 != 0) {
        *(undefined8 *)(in_RSI + 0xe0) = 0;
        archive_strncat((archive_string *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
        for (in_stack_ffffffffffffffa4 = 0;
            (ulong)in_stack_ffffffffffffffa4 < *(ulong *)(in_RSI + 0xe0);
            in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1) {
          if (*(char *)(*(long *)(in_RSI + 0xd8) + (ulong)in_stack_ffffffffffffffa4) == -1) {
            *(undefined1 *)(*(long *)(in_RSI + 0xd8) + (ulong)in_stack_ffffffffffffffa4) = 0x2f;
          }
        }
        if (*(char *)(*(long *)(in_RSI + 0xd8) + *(long *)(in_RSI + 0xe0) + -1) != '/') break;
      }
    }
    else if (in_stack_ffffffffffffff7c == 0x40) {
      if (uVar5 == 2) {
        uVar1 = archive_le16dec(pp);
        *(char *)(in_RSI + 0x120) = (char)uVar1;
      }
    }
    else if (in_stack_ffffffffffffff7c == 0x41) {
      if (uVar5 == 0x18) {
        uVar7 = archive_le64dec(in_stack_ffffffffffffff80);
        tVar6 = lha_win_time(uVar7,(long *)(in_RSI + 0x50));
        *(time_t *)(in_RSI + 0x48) = tVar6;
        uVar7 = archive_le64dec(in_stack_ffffffffffffff80);
        tVar6 = lha_win_time(uVar7,(long *)(in_RSI + 0x60));
        *(time_t *)(in_RSI + 0x58) = tVar6;
        uVar7 = archive_le64dec(in_stack_ffffffffffffff80);
        tVar6 = lha_win_time(uVar7,(long *)(in_RSI + 0x70));
        *(time_t *)(in_RSI + 0x68) = tVar6;
        *(uint *)(in_RSI + 0x40) = *(uint *)(in_RSI + 0x40) | 3;
      }
    }
    else if (in_stack_ffffffffffffff7c == 0x42) {
      if (uVar5 == 0x10) {
        uVar7 = archive_le64dec(in_stack_ffffffffffffff80);
        *(uint64_t *)(in_RSI + 0x30) = uVar7;
        uVar7 = archive_le64dec(in_stack_ffffffffffffff80);
        *(uint64_t *)(in_RSI + 0x38) = uVar7;
      }
    }
    else if (2 < in_stack_ffffffffffffff7c - 0x43) {
      if (in_stack_ffffffffffffff7c == 0x46) {
        if (uVar5 == 4) {
          charset_00 = (archive_read *)0x0;
          in_stack_ffffffffffffff90 = (archive_conflict *)0x0;
          in_stack_ffffffffffffff98 = (void *)0x0;
          uVar3 = archive_le32dec(pp);
          if (uVar3 == 0xfde9) {
            in_stack_ffffffffffffff80 = (archive_read *)0x1b250b;
          }
          else {
            uVar3 = archive_le32dec(pp);
            in_stack_ffffffffffffff80 = charset_00;
            archive_string_sprintf((archive_string *)&stack0xffffffffffffff88,"CP%d",(ulong)uVar3);
            charset_00 = in_stack_ffffffffffffff80;
          }
          paVar8 = archive_string_conversion_from_charset
                             (in_stack_ffffffffffffff90,(char *)charset_00,
                              (wchar_t)((ulong)in_stack_ffffffffffffff80 >> 0x20));
          *(archive_string_conv **)(in_RSI + 200) = paVar8;
          archive_string_free((archive_string *)0x1523d0);
          if (*(long *)(in_RSI + 200) == 0) {
            return L'\xffffffe2';
          }
        }
      }
      else if (in_stack_ffffffffffffff7c == 0x50) {
        if (uVar5 == 2) {
          uVar1 = archive_le16dec(pp);
          *(uint *)(in_RSI + 0x78) = (uint)uVar1;
          *(uint *)(in_RSI + 0x40) = *(uint *)(in_RSI + 0x40) | 4;
        }
      }
      else if (in_stack_ffffffffffffff7c == 0x51) {
        if (uVar5 == 4) {
          uVar1 = archive_le16dec(pp);
          *(ulong *)(in_RSI + 0x88) = (ulong)uVar1;
          uVar1 = archive_le16dec((void *)((long)pp + 2));
          *(ulong *)(in_RSI + 0x80) = (ulong)uVar1;
        }
      }
      else if (in_stack_ffffffffffffff7c == 0x52) {
        if (uVar5 != 0) {
          *(undefined8 *)(in_RSI + 0xb0) = 0;
          archive_strncat((archive_string *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
        }
      }
      else if (in_stack_ffffffffffffff7c == 0x53) {
        if (uVar5 != 0) {
          *(undefined8 *)(in_RSI + 0x98) = 0;
          archive_strncat((archive_string *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
        }
      }
      else if (in_stack_ffffffffffffff7c == 0x54) {
        if (uVar5 == 4) {
          uVar3 = archive_le32dec(pp);
          *(ulong *)(in_RSI + 0x58) = (ulong)uVar3;
        }
      }
      else if (in_stack_ffffffffffffff7c == 0x7f) {
        if (uVar5 == 0x10) {
          uVar1 = archive_le16dec(pp);
          *(char *)(in_RSI + 0x120) = (char)uVar1;
          uVar1 = archive_le16dec((void *)((long)pp + 2));
          *(uint *)(in_RSI + 0x78) = (uint)uVar1;
          uVar1 = archive_le16dec((void *)((long)pp + 4));
          *(ulong *)(in_RSI + 0x88) = (ulong)uVar1;
          uVar1 = archive_le16dec((void *)((long)pp + 6));
          *(ulong *)(in_RSI + 0x80) = (ulong)uVar1;
          uVar3 = archive_le32dec((void *)((long)pp + 8));
          *(ulong *)(in_RSI + 0x48) = (ulong)uVar3;
          uVar3 = archive_le32dec((void *)((long)pp + 0xc));
          *(ulong *)(in_RSI + 0x68) = (ulong)uVar3;
          *(uint *)(in_RSI + 0x40) = *(uint *)(in_RSI + 0x40) | 7;
        }
      }
      else if ((in_stack_ffffffffffffff7c == 0xff) && (uVar5 == 0x14)) {
        uVar3 = archive_le32dec(pp);
        *(uint32_t *)(in_RSI + 0x78) = uVar3;
        uVar3 = archive_le32dec((void *)((long)pp + 4));
        *(ulong *)(in_RSI + 0x88) = (ulong)uVar3;
        uVar3 = archive_le32dec((void *)((long)pp + 8));
        *(ulong *)(in_RSI + 0x80) = (ulong)uVar3;
        uVar3 = archive_le32dec((void *)((long)pp + 0xc));
        *(ulong *)(in_RSI + 0x48) = (ulong)uVar3;
        uVar3 = archive_le32dec((void *)((long)pp + 0x10));
        *(ulong *)(in_RSI + 0x68) = (ulong)uVar3;
        *(uint *)(in_RSI + 0x40) = *(uint *)(in_RSI + 0x40) | 7;
      }
    }
    __archive_read_consume
              (in_stack_ffffffffffffff80,
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  archive_set_error(in_RDI,0x54,"Invalid extended LHa header");
  return L'\xffffffe2';
}

Assistant:

static int
lha_read_file_extended_header(struct archive_read *a, struct lha *lha,
    uint16_t *crc, int sizefield_length, size_t limitsize, size_t *total_size)
{
	const void *h;
	const unsigned char *extdheader;
	size_t	extdsize;
	size_t	datasize;
	unsigned int i;
	unsigned char extdtype;

#define EXT_HEADER_CRC		0x00		/* Header CRC and information*/
#define EXT_FILENAME		0x01		/* Filename 		    */
#define EXT_DIRECTORY		0x02		/* Directory name	    */
#define EXT_DOS_ATTR		0x40		/* MS-DOS attribute	    */
#define EXT_TIMESTAMP		0x41		/* Windows time stamp	    */
#define EXT_FILESIZE		0x42		/* Large file size	    */
#define EXT_TIMEZONE		0x43		/* Time zone		    */
#define EXT_UTF16_FILENAME	0x44		/* UTF-16 filename 	    */
#define EXT_UTF16_DIRECTORY	0x45		/* UTF-16 directory name    */
#define EXT_CODEPAGE		0x46		/* Codepage		    */
#define EXT_UNIX_MODE		0x50		/* File permission	    */
#define EXT_UNIX_GID_UID	0x51		/* gid,uid		    */
#define EXT_UNIX_GNAME		0x52		/* Group name		    */
#define EXT_UNIX_UNAME		0x53		/* User name		    */
#define EXT_UNIX_MTIME		0x54		/* Modified time	    */
#define EXT_OS2_NEW_ATTR	0x7f		/* new attribute(OS/2 only) */
#define EXT_NEW_ATTR		0xff		/* new attribute	    */

	*total_size = sizefield_length;

	for (;;) {
		/* Read an extended header size. */
		if ((h =
		    __archive_read_ahead(a, sizefield_length, NULL)) == NULL)
			return (truncated_error(a));
		/* Check if the size is the zero indicates the end of the
		 * extended header. */
		if (sizefield_length == sizeof(uint16_t))
			extdsize = archive_le16dec(h);
		else
			extdsize = archive_le32dec(h);
		if (extdsize == 0) {
			/* End of extended header */
			if (crc != NULL)
				*crc = lha_crc16(*crc, h, sizefield_length);
			__archive_read_consume(a, sizefield_length);
			return (ARCHIVE_OK);
		}

		/* Sanity check to the extended header size. */
		if (((uint64_t)*total_size + extdsize) >
				    (uint64_t)limitsize ||
		    extdsize <= (size_t)sizefield_length)
			goto invalid;

		/* Read the extended header. */
		if ((h = __archive_read_ahead(a, extdsize, NULL)) == NULL)
			return (truncated_error(a));
		*total_size += extdsize;

		extdheader = (const unsigned char *)h;
		/* Get the extended header type. */
		extdtype = extdheader[sizefield_length];
		/* Calculate an extended data size. */
		datasize = extdsize - (1 + sizefield_length);
		/* Skip an extended header size field and type field. */
		extdheader += sizefield_length + 1;

		if (crc != NULL && extdtype != EXT_HEADER_CRC)
			*crc = lha_crc16(*crc, h, extdsize);
		switch (extdtype) {
		case EXT_HEADER_CRC:
			/* We only use a header CRC. Following data will not
			 * be used. */
			if (datasize >= 2) {
				lha->header_crc = archive_le16dec(extdheader);
				if (crc != NULL) {
					static const char zeros[2] = {0, 0};
					*crc = lha_crc16(*crc, h,
					    extdsize - datasize);
					/* CRC value itself as zero */
					*crc = lha_crc16(*crc, zeros, 2);
					*crc = lha_crc16(*crc,
					    extdheader+2, datasize - 2);
				}
			}
			break;
		case EXT_FILENAME:
			if (datasize == 0) {
				/* maybe directory header */
				archive_string_empty(&lha->filename);
				break;
			}
			archive_strncpy(&lha->filename,
			    (const char *)extdheader, datasize);
			break;
		case EXT_DIRECTORY:
			if (datasize == 0)
				/* no directory name data. exit this case. */
				break;

			archive_strncpy(&lha->dirname,
		  	    (const char *)extdheader, datasize);
			/*
			 * Convert directory delimiter from 0xFF
			 * to '/' for local system.
	 		 */
			for (i = 0; i < lha->dirname.length; i++) {
				if ((unsigned char)lha->dirname.s[i] == 0xFF)
					lha->dirname.s[i] = '/';
			}
			/* Is last character directory separator? */
			if (lha->dirname.s[lha->dirname.length-1] != '/')
				/* invalid directory data */
				goto invalid;
			break;
		case EXT_DOS_ATTR:
			if (datasize == 2)
				lha->dos_attr = (unsigned char)
				    (archive_le16dec(extdheader) & 0xff);
			break;
		case EXT_TIMESTAMP:
			if (datasize == (sizeof(uint64_t) * 3)) {
				lha->birthtime = lha_win_time(
				    archive_le64dec(extdheader),
				    &lha->birthtime_tv_nsec);
				extdheader += sizeof(uint64_t);
				lha->mtime = lha_win_time(
				    archive_le64dec(extdheader),
				    &lha->mtime_tv_nsec);
				extdheader += sizeof(uint64_t);
				lha->atime = lha_win_time(
				    archive_le64dec(extdheader),
				    &lha->atime_tv_nsec);
				lha->setflag |= BIRTHTIME_IS_SET |
				    ATIME_IS_SET;
			}
			break;
		case EXT_FILESIZE:
			if (datasize == sizeof(uint64_t) * 2) {
				lha->compsize = archive_le64dec(extdheader);
				extdheader += sizeof(uint64_t);
				lha->origsize = archive_le64dec(extdheader);
			}
			break;
		case EXT_CODEPAGE:
			/* Get an archived filename charset from codepage.
			 * This overwrites the charset specified by
			 * hdrcharset option. */
			if (datasize == sizeof(uint32_t)) {
				struct archive_string cp;
				const char *charset;

				archive_string_init(&cp);
				switch (archive_le32dec(extdheader)) {
				case 65001: /* UTF-8 */
					charset = "UTF-8";
					break;
				default:
					archive_string_sprintf(&cp, "CP%d",
					    (int)archive_le32dec(extdheader));
					charset = cp.s;
					break;
				}
				lha->sconv =
				    archive_string_conversion_from_charset(
					&(a->archive), charset, 1);
				archive_string_free(&cp);
				if (lha->sconv == NULL)
					return (ARCHIVE_FATAL);
			}
			break;
		case EXT_UNIX_MODE:
			if (datasize == sizeof(uint16_t)) {
				lha->mode = archive_le16dec(extdheader);
				lha->setflag |= UNIX_MODE_IS_SET;
			}
			break;
		case EXT_UNIX_GID_UID:
			if (datasize == (sizeof(uint16_t) * 2)) {
				lha->gid = archive_le16dec(extdheader);
				lha->uid = archive_le16dec(extdheader+2);
			}
			break;
		case EXT_UNIX_GNAME:
			if (datasize > 0)
				archive_strncpy(&lha->gname,
				    (const char *)extdheader, datasize);
			break;
		case EXT_UNIX_UNAME:
			if (datasize > 0)
				archive_strncpy(&lha->uname,
				    (const char *)extdheader, datasize);
			break;
		case EXT_UNIX_MTIME:
			if (datasize == sizeof(uint32_t))
				lha->mtime = archive_le32dec(extdheader);
			break;
		case EXT_OS2_NEW_ATTR:
			/* This extended header is OS/2 depend. */
			if (datasize == 16) {
				lha->dos_attr = (unsigned char)
				    (archive_le16dec(extdheader) & 0xff);
				lha->mode = archive_le16dec(extdheader+2);
				lha->gid = archive_le16dec(extdheader+4);
				lha->uid = archive_le16dec(extdheader+6);
				lha->birthtime = archive_le32dec(extdheader+8);
				lha->atime = archive_le32dec(extdheader+12);
				lha->setflag |= UNIX_MODE_IS_SET
				    | BIRTHTIME_IS_SET | ATIME_IS_SET;
			}
			break;
		case EXT_NEW_ATTR:
			if (datasize == 20) {
				lha->mode = (mode_t)archive_le32dec(extdheader);
				lha->gid = archive_le32dec(extdheader+4);
				lha->uid = archive_le32dec(extdheader+8);
				lha->birthtime = archive_le32dec(extdheader+12);
				lha->atime = archive_le32dec(extdheader+16);
				lha->setflag |= UNIX_MODE_IS_SET
				    | BIRTHTIME_IS_SET | ATIME_IS_SET;
			}
			break;
		case EXT_TIMEZONE:		/* Not supported */
		case EXT_UTF16_FILENAME:	/* Not supported */
		case EXT_UTF16_DIRECTORY:	/* Not supported */
		default:
			break;
		}

		__archive_read_consume(a, extdsize);
	}
invalid:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Invalid extended LHa header");
	return (ARCHIVE_FATAL);
}